

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluStrUtil.cpp
# Opt level: O3

ostream * eglu::operator<<(ostream *str,SurfaceAttribListFmt *fmt)

{
  uint value;
  SurfaceAttribValueFmt in_RAX;
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  SurfaceAttribValueFmt SVar6;
  SurfaceAttribValueFmt local_38;
  
  local_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(str,"{ ",2);
  iVar5 = 0;
  while( true ) {
    value = *(uint *)(*(long *)fmt + (long)iVar5 * 4);
    SVar6.value = 0;
    SVar6.attribute = value;
    if (iVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
    }
    if (value == 0x3038) break;
    pcVar1 = getSurfaceAttribName(value);
    if (pcVar1 == (char *)0x0) {
      local_38 = SVar6;
      poVar3 = tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_38,str);
      pcVar1 = ", ???";
      lVar4 = 5;
LAB_0035b91d:
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1,lVar4);
      std::__ostream_insert<char,std::char_traits<char>>(str," }",2);
      return str;
    }
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(str,pcVar1,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
    local_38.value = *(int *)(*(long *)fmt + (long)(iVar5 + 1) * 4);
    local_38.attribute = value;
    operator<<(str,&local_38);
    iVar5 = iVar5 + 2;
  }
  pcVar1 = "EGL_NONE";
  lVar4 = 8;
  poVar3 = str;
  goto LAB_0035b91d;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const SurfaceAttribListFmt& fmt)
{
	int pos = 0;

	str << "{ ";

	for (;;)
	{
		int attrib = fmt.attribs[pos];

		if (pos != 0)
			str << ", ";

		if (attrib == EGL_NONE)
		{
			// Terminate.
			str << "EGL_NONE";
			break;
		}

		const char*	attribName = getSurfaceAttribName(attrib);

		if (attribName)
		{
			// Valid attribute, print value.
			str << attribName << ", " << getSurfaceAttribValueStr(attrib, fmt.attribs[pos+1]);
			pos += 2;
		}
		else
		{
			// Invalid attribute. Terminate parsing.
			str << tcu::toHex(attrib) << ", ???";
			break;
		}
	}

	str << " }";
	return str;
}